

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O3

void free_dfg(CManager cm,void *vdfg)

{
  void *__ptr;
  int iVar1;
  long lVar2;
  
  iVar1 = *(int *)((long)vdfg + 0x10);
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      __ptr = *(void **)(*(long *)((long)vdfg + 0x18) + lVar2 * 8);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        iVar1 = *(int *)((long)vdfg + 0x10);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  if (*(void **)((long)vdfg + 0x18) != (void *)0x0) {
    free(*(void **)((long)vdfg + 0x18));
  }
  if (*(EVdfg_configuration *)((long)vdfg + 0x30) != (EVdfg_configuration)0x0) {
    free_dfg_state(*(EVdfg_configuration *)((long)vdfg + 0x30));
  }
  if (*(EVdfg_configuration *)((long)vdfg + 0x38) != (EVdfg_configuration)0x0) {
    free_dfg_state(*(EVdfg_configuration *)((long)vdfg + 0x38));
  }
  free(vdfg);
  return;
}

Assistant:

static void
free_dfg(CManager cm, void *vdfg)
{
    EVdfg dfg = vdfg;
    int i;
    for (i=0; i < dfg->stone_count; i++) {
	if (dfg->stones[i]) free(dfg->stones[i]);
    }
    if (dfg->stones) free(dfg->stones);
    if (dfg->deployed_state) free_dfg_state(dfg->deployed_state);
    if (dfg->working_state) free_dfg_state(dfg->working_state);
    free(dfg);
}